

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

void Gia_ManFindXorInt(word *pOff,word *pOn,Vec_Int_t *vBinate,Vec_Ptr_t *vDivs,int nWords,
                      Vec_Int_t *vUnatePairs)

{
  int iVar1;
  int b;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  word *pIn0;
  word *pIn1;
  word *pDiv1;
  word *pDiv0;
  int iDiv1;
  int iDiv0;
  int Limit2;
  int iDiv1_;
  int iDiv0_;
  int k;
  int i;
  Vec_Int_t *vUnatePairs_local;
  int nWords_local;
  Vec_Ptr_t *vDivs_local;
  Vec_Int_t *vBinate_local;
  word *pOn_local;
  word *pOff_local;
  
  iVar1 = Vec_IntSize(vBinate);
  for (iDiv0_ = 0; iDiv0_ < iVar1; iDiv0_ = iDiv0_ + 1) {
    b = Vec_IntEntry(vBinate,iDiv0_);
    for (iDiv1_ = 0; iDiv1_ < iDiv0_; iDiv1_ = iDiv1_ + 1) {
      iVar2 = Vec_IntEntry(vBinate,iDiv1_);
      iVar3 = Abc_MinInt(iVar2,b);
      iVar2 = Abc_MaxInt(iVar2,b);
      pIn0 = (word *)Vec_PtrEntry(vDivs,iVar3);
      pIn1 = (word *)Vec_PtrEntry(vDivs,iVar2);
      iVar4 = Abc_TtIntersectXor(pOff,0,pIn0,pIn1,0,nWords);
      if (iVar4 == 0) {
        iVar3 = Abc_Var2Lit(iVar3,0);
        uVar5 = Abc_Var2Lit(iVar2,0);
        iVar2 = Abc_Var2Lit(iVar3 << 0xf | uVar5,0);
        Vec_IntPush(vUnatePairs,iVar2);
      }
      else {
        iVar4 = Abc_TtIntersectXor(pOff,0,pIn0,pIn1,1,nWords);
        if (iVar4 == 0) {
          iVar3 = Abc_Var2Lit(iVar3,0);
          uVar5 = Abc_Var2Lit(iVar2,0);
          iVar2 = Abc_Var2Lit(iVar3 << 0xf | uVar5,1);
          Vec_IntPush(vUnatePairs,iVar2);
        }
      }
    }
  }
  return;
}

Assistant:

void Gia_ManFindXorInt( word * pOff, word * pOn, Vec_Int_t * vBinate, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnatePairs )
{
    int i, k, iDiv0_, iDiv1_;
    int Limit2 = Vec_IntSize(vBinate);//Abc_MinInt( Vec_IntSize(vBinate), 100 );
    Vec_IntForEachEntryStop( vBinate, iDiv1_, i, Limit2 )
    Vec_IntForEachEntryStop( vBinate, iDiv0_, k, i )
    {
        int iDiv0 = Abc_MinInt( iDiv0_, iDiv1_ );
        int iDiv1 = Abc_MaxInt( iDiv0_, iDiv1_ );
        word * pDiv0 = (word *)Vec_PtrEntry(vDivs, iDiv0);
        word * pDiv1 = (word *)Vec_PtrEntry(vDivs, iDiv1);
        if ( !Abc_TtIntersectXor( pOff, 0, pDiv0, pDiv1, 0, nWords ) )
            Vec_IntPush( vUnatePairs, Abc_Var2Lit((Abc_Var2Lit(iDiv0, 0) << 15) | Abc_Var2Lit(iDiv1, 0), 0) );
        else if ( !Abc_TtIntersectXor( pOff, 0, pDiv0, pDiv1, 1, nWords ) )
            Vec_IntPush( vUnatePairs, Abc_Var2Lit((Abc_Var2Lit(iDiv0, 0) << 15) | Abc_Var2Lit(iDiv1, 0), 1) );
    }
}